

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

dgEdge * __thiscall dgPolyhedra::AddFace(dgPolyhedra *this,HaI32 count,HaI32 *index,HaI64 *userdata)

{
  uint dummy;
  bool bVar1;
  dgEdge *pdVar2;
  dgTreeNode *pdVar3;
  HaI64 value;
  HaI32 *extraout_RDX;
  HaU64 HVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool state;
  dgEdge *local_40d0;
  dgPolyhedra *local_40c8;
  dgTreeNode *local_40c0;
  HaU64 *local_40b8;
  uint *local_40b0;
  long local_40a8;
  long local_40a0;
  dgEdge tmpEdge_1;
  dgEdge tmpEdge;
  IntersectionFilter selfIntersectingFaceFilter;
  
  local_40a0 = (long)count;
  local_40d0 = (dgEdge *)0x0;
  uVar7 = 0;
  selfIntersectingFaceFilter.m_count = 0;
  local_40a8 = local_40a0 + -1;
  local_40c0 = (dgTreeNode *)(ulong)(uint)(~(count >> 0x1f) & count);
  uVar6 = index[local_40a0 + -1];
  local_40c8 = this;
  local_40b8 = (HaU64 *)userdata;
  local_40b0 = (uint *)index;
  while( true ) {
    if (local_40c0 == (dgTreeNode *)uVar7) {
      tmpEdge.m_incidentFace = local_40c8->m_faceSecuence + 1;
      local_40c8->m_faceSecuence = tmpEdge.m_incidentFace;
      tmpEdge.m_incidentVertex = local_40b0[local_40a8];
      uVar6 = *local_40b0;
      if (local_40b8 == (HaU64 *)0x0) {
        tmpEdge.m_userData = 0;
        HVar4 = 0;
      }
      else {
        tmpEdge.m_userData = local_40b8[local_40a8];
        HVar4 = *local_40b8;
      }
      tmpEdge.m_next = (dgEdge *)0x0;
      tmpEdge.m_prev._0_4_ = 0;
      tmpEdge.m_prev._4_4_ = 0;
      tmpEdge.m_twin._0_4_ = 0;
      tmpEdge._36_8_ = 0;
      pdVar3 = dgTree<dgEdge,_long>::Insert
                         (&local_40c8->super_dgTree<dgEdge,_long>,&tmpEdge,
                          (long)tmpEdge.m_incidentVertex << 0x20 | (long)(int)uVar6,&state);
      if (state != true) {
        local_40d0 = &pdVar3->m_info;
        lVar5 = 1;
        tmpEdge_1.m_userData = HVar4;
        pdVar2 = local_40d0;
        tmpEdge_1.m_incidentVertex = uVar6;
        local_40c0 = pdVar3;
        while( true ) {
          if (local_40a0 <= lVar5) {
            (local_40c0->m_info).m_prev = pdVar2;
            pdVar2->m_next = local_40d0;
            return (local_40c0->m_info).m_next;
          }
          if (local_40b8 == (HaU64 *)0x0) {
            HVar4 = 0;
          }
          else {
            HVar4 = local_40b8[lVar5];
          }
          uVar6 = local_40b0[lVar5];
          tmpEdge_1.m_incidentFace = local_40c8->m_faceSecuence;
          tmpEdge_1.m_twin._0_4_ = 0;
          tmpEdge_1._36_8_ = 0;
          tmpEdge_1.m_next = (dgEdge *)0x0;
          tmpEdge_1.m_prev._0_4_ = 0;
          tmpEdge_1.m_prev._4_4_ = 0;
          pdVar3 = dgTree<dgEdge,_long>::Insert
                             (&local_40c8->super_dgTree<dgEdge,_long>,&tmpEdge_1,
                              (ulong)(uint)tmpEdge_1.m_incidentVertex << 0x20 | (long)(int)uVar6,
                              &state);
          if (state == true) break;
          lVar5 = lVar5 + 1;
          pdVar2->m_next = &pdVar3->m_info;
          (pdVar3->m_info).m_prev = pdVar2;
          tmpEdge_1.m_userData = HVar4;
          pdVar2 = &pdVar3->m_info;
          tmpEdge_1.m_incidentVertex = uVar6;
        }
        __assert_fail("!state",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0x780,
                      "dgEdge *dgPolyhedra::AddFace(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI64 *const)"
                     );
      }
      __assert_fail("!state",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0x773,
                    "dgEdge *dgPolyhedra::AddFace(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI64 *const)"
                   );
    }
    dummy = local_40b0[uVar7];
    bVar1 = AddFace::IntersectionFilter::Insert(&selfIntersectingFaceFilter,dummy,(HaI64)index);
    if (!bVar1) {
      return local_40d0;
    }
    bVar1 = AddFace::IntersectionFilter::Insert(&selfIntersectingFaceFilter,uVar6,value);
    if (!bVar1) break;
    if (uVar6 == dummy) {
      return local_40d0;
    }
    pdVar2 = FindEdge(local_40c8,uVar6,dummy);
    uVar7 = uVar7 + 1;
    index = extraout_RDX;
    uVar6 = dummy;
    if (pdVar2 != (dgEdge *)0x0) {
      return local_40d0;
    }
  }
  return local_40d0;
}

Assistant:

dgEdge* dgPolyhedra::AddFace ( hacd::HaI32 count, const hacd::HaI32* const index, const hacd::HaI64* const userdata)
{
	class IntersectionFilter
	{
		public:
		IntersectionFilter ()
		{
			m_count = 0;
		}

		bool Insert (hacd::HaI32 dummy, hacd::HaI64 value)
		{
			hacd::HaI32 i;				
			for (i = 0 ; i < m_count; i ++) {
				if (m_array[i] == value) {
					return false;
				}
			}
			m_array[i] = value;
			m_count ++;
			return true;
		}

		hacd::HaI32 m_count;
		hacd::HaI64 m_array[2048];
	};

	IntersectionFilter selfIntersectingFaceFilter;

	hacd::HaI32 dummyValues = 0;
	hacd::HaI32 i0 = index[count-1];
	for (hacd::HaI32 i = 0; i < count; i ++) {
		hacd::HaI32 i1 = index[i];
		dgPairKey code0 (i0, i1);

		if (!selfIntersectingFaceFilter.Insert (dummyValues, code0.GetVal())) {
			return NULL;
		}

		dgPairKey code1 (i1, i0);
		if (!selfIntersectingFaceFilter.Insert (dummyValues, code1.GetVal())) {
			return NULL;
		}


		if (i0 == i1) {
			return NULL;
		}
		if (FindEdge (i0, i1)) {
			return NULL;
		}
		i0 = i1;
	}

	m_faceSecuence ++;

	i0 = index[count-1];
	hacd::HaI32 i1 = index[0];
	hacd::HaU64 udata0 = 0;
	hacd::HaU64 udata1 = 0;
	if (userdata) {
		udata0 = hacd::HaU64 (userdata[count-1]);
		udata1 = hacd::HaU64 (userdata[0]);
	} 

	bool state;
	dgPairKey code (i0, i1);
	dgEdge tmpEdge (i0, m_faceSecuence, udata0);
	dgTreeNode* node = Insert (tmpEdge, code.GetVal(), state); 
	HACD_ASSERT (!state);
	dgEdge* edge0 = &node->GetInfo();
	dgEdge* const first = edge0;

	for (hacd::HaI32 i = 1; i < count; i ++) {
		i0 = i1;
		i1 = index[i];
		udata0 = udata1;
		udata1 = hacd::HaU64 (userdata ? userdata[i] : 0);

		dgPairKey code (i0, i1);
		dgEdge tmpEdge (i0, m_faceSecuence, udata0);
		node = Insert (tmpEdge, code.GetVal(), state); 
		HACD_ASSERT (!state);

		dgEdge* const edge1 = &node->GetInfo();
		edge0->m_next = edge1;
		edge1->m_prev = edge0;
		edge0 = edge1;
	}

	first->m_prev = edge0;
	edge0->m_next = first;

	return first->m_next;
}